

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O3

void __thiscall OpenMD::RestraintStamp::~RestraintStamp(RestraintStamp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__RestraintStamp_002fb940;
  (this->Print).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002f7ae0
  ;
  pcVar2 = (this->Print).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Print).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->RestrainedSwingYAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->RestrainedSwingYAngle).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->RestrainedSwingYAngle).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->RestrainedSwingXAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->RestrainedSwingXAngle).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->RestrainedSwingXAngle).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->RestrainedTwistAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->RestrainedTwistAngle).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->RestrainedTwistAngle).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->AbsolutePositionZ).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->AbsolutePositionZ).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->AbsolutePositionZ).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->SwingYSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->SwingYSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SwingYSpringConstant).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->SwingXSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->SwingXSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SwingXSpringConstant).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->TwistSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->TwistSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->TwistSpringConstant).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->AbsoluteSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->AbsoluteSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->AbsoluteSpringConstant).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->DisplacementSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->DisplacementSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->DisplacementSpringConstant).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->MolIndex).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->MolIndex).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MolIndex).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->ObjectSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7b50;
  pcVar2 = (this->ObjectSelection).data_._M_dataplus._M_p;
  paVar1 = &(this->ObjectSelection).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->ObjectSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->ObjectSelection).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ObjectSelection).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Type).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_002f7b50;
  pcVar2 = (this->Type).data_._M_dataplus._M_p;
  paVar1 = &(this->Type).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Type).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002f7ae0;
  pcVar2 = (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Type).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__DataHolder_002f7bc8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).deprecatedKeywords_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).parameters_._M_t);
  return;
}

Assistant:

RestraintStamp::~RestraintStamp() {}